

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_mapper.h
# Opt level: O2

void __thiscall
icu_63::number::impl::CurrencyPluralInfoAffixProvider::CurrencyPluralInfoAffixProvider
          (CurrencyPluralInfoAffixProvider *this)

{
  PropertiesAffixPatternProvider *this_00;
  long lVar1;
  
  (this->super_AffixPatternProvider)._vptr_AffixPatternProvider =
       (_func_int **)&PTR__CurrencyPluralInfoAffixProvider_003a69a0;
  this_00 = this->affixesByPlural;
  lVar1 = 0;
  do {
    PropertiesAffixPatternProvider::PropertiesAffixPatternProvider(this_00);
    lVar1 = lVar1 + -0x110;
    this_00 = this_00 + 1;
  } while (lVar1 != -0x660);
  this->fBogus = true;
  return;
}

Assistant:

bool isBogus() const {
        return fBogus;
    }